

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testravidebug.c
# Opt level: O0

int test_initreq(void)

{
  int iVar1;
  size_t sVar2;
  char acStack_17e48 [8];
  char testdata2 [173];
  char *expected2;
  char *expected;
  membuff_t mb;
  ProtocolMessage res;
  undefined1 local_bf20 [4];
  int msgtype;
  ProtocolMessage msg;
  char testdata [200];
  
  memcpy((void *)((long)&msg.u + 0xbe30),
         "{\"type\":\"request\",\"seq\":1,\"command\":\"initialize\",\"arguments\":{\"adapterID\":\"lua\",\"pathFormat\":\"path\",\"linesStartAt1\":true,\"columnsStartAt1\":true}}"
         ,200);
  sVar2 = strlen((char *)((long)&msg.u + 0xbe30));
  iVar1 = vscode_parse_message
                    ((char *)((long)&msg.u + 0xbe30),sVar2,(ProtocolMessage *)local_bf20,_stderr);
  if (((((iVar1 != 1) || (msg._0_8_ != 1)) || (local_bf20 != (undefined1  [4])0x1)) ||
      (((iVar1 = strcmp((char *)((long)&msg.seq + 4),"initialize"), iVar1 != 0 ||
        ((int)msg.seq != 1)) ||
       ((iVar1 = strcmp(msg.u.Event.event + 0x1c,"lua"), iVar1 != 0 ||
        ((msg.u._88_4_ != 1 || (msg.u._84_4_ != 1)))))))) ||
     (iVar1 = strcmp(msg.u.Response.message + 0x2a,"path"), iVar1 != 0)) {
    return 1;
  }
  vscode_make_error_response
            ((ProtocolMessage *)local_bf20,(ProtocolMessage *)&mb.pos,1,"unable to initialize");
  membuff_init((membuff_t *)&expected,0);
  vscode_serialize_response_new((membuff_t *)&expected,(ProtocolMessage *)&mb.pos);
  iVar1 = strcmp("{\"type\":\"response\",\"seq\":1,\"command\":\"initialize\",\"request_seq\":1,\"success\":false,\"message\":\"unable to initialize\"}"
                 ,expected);
  if (iVar1 != 0) {
    membuff_free((membuff_t *)&expected);
    return 1;
  }
  vscode_make_success_response((ProtocolMessage *)local_bf20,(ProtocolMessage *)&mb.pos,1);
  membuff_rewindpos((membuff_t *)&expected);
  vscode_serialize_response_new((membuff_t *)&expected,(ProtocolMessage *)&mb.pos);
  stack0xfffffffffffe8268 =
       "{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,\"supportsFunctionBreakpoints\":false,\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":false}}"
  ;
  iVar1 = strcmp("{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,\"supportsFunctionBreakpoints\":false,\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":false}}"
                 ,expected);
  if (iVar1 != 0) {
    membuff_free((membuff_t *)&expected);
    return 1;
  }
  memcpy(acStack_17e48,
         "{\"type\":\"request\",\"seq\":2,\"command\":\"setBreakpoints\",\"arguments\":{\"source\":{\"path\":\"c:\\\\github\\\\ravi\\\\ravi-tests\\\\simple.lua\"},\"lines\" : [6],\"breakpoints\" : [{\"line\":6}]} }"
         ,0xad);
  sVar2 = strlen(acStack_17e48);
  iVar1 = vscode_parse_message(acStack_17e48,sVar2,(ProtocolMessage *)local_bf20,_stderr);
  if (((((iVar1 == 6) && (msg._0_8_ == 2)) && (local_bf20 == (undefined1  [4])0x1)) &&
      ((iVar1 = strcmp((char *)((long)&msg.seq + 4),"setBreakpoints"), iVar1 == 0 &&
       ((int)msg.seq == 6)))) &&
     ((iVar1 = strcmp(msg.u.Response.message + 0x20,"c:/github/ravi/ravi-tests/simple.lua"),
      iVar1 == 0 && (msg.u._936_4_ == 6)))) {
    membuff_free((membuff_t *)&expected);
    return 0;
  }
  membuff_free((membuff_t *)&expected);
  return 1;
}

Assistant:

int test_initreq() {
  char testdata[200] =
    "{\"type\":\"request\",\"seq\":1,\"command\":\"initialize\","
    "\"arguments\":{\"adapterID\":\"lua\",\"pathFormat\":\"path\","
    "\"linesStartAt1\":true,\"columnsStartAt1\":true}}";
  ProtocolMessage msg;
  int msgtype = vscode_parse_message(testdata, strlen(testdata), &msg, stderr);
  if (msgtype != VSCODE_INITIALIZE_REQUEST || msg.seq != 1 ||
    msg.type != VSCODE_REQUEST ||
    strcmp(msg.u.Request.command, "initialize") != 0 ||
    msg.u.Request.request_type != VSCODE_INITIALIZE_REQUEST ||
    strcmp(msg.u.Request.u.InitializeRequest.adapterID, "lua") != 0 ||
    msg.u.Request.u.InitializeRequest.columnsStartAt1 != 1 ||
    msg.u.Request.u.InitializeRequest.linesStartAt1 != 1 ||
    strcmp(msg.u.Request.u.InitializeRequest.pathFormat, "path") != 0) {
    return 1;
  }
  ProtocolMessage res;
  vscode_make_error_response(&msg, &res, VSCODE_INITIALIZE_RESPONSE,
                             "unable to initialize");
  //char buf[1024];
  membuff_t mb;
  membuff_init(&mb, 0);
  vscode_serialize_response_new(&mb, &res);
  //printf(buf);
  const char *expected =
      "{\"type\":\"response\",\"seq\":1,\"command\":\"initialize\",\"request_seq\":1,"
      "\"success\":false,\"message\":\"unable to initialize\"}";
  if (strcmp(expected, mb.buf) != 0) {
	  membuff_free(&mb);  
	  return 1;
  }
  vscode_make_success_response(&msg, &res, VSCODE_INITIALIZE_RESPONSE);
  membuff_rewindpos(&mb);
  vscode_serialize_response_new(&mb, &res);
  const char *expected2 =
      "{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,"
      "\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,"
      "\"supportsFunctionBreakpoints\":false,"
      "\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":"
      "false}}";
  if (strcmp(expected2, mb.buf) != 0) {
	  membuff_free(&mb);  
	  return 1;
  }
  char testdata2[] = "{\"type\":\"request\",\"seq\":2,\"command\":\"setBreakpoints\",\"arguments\":{\"source\":{\"path\":\"c:\\\\github\\\\ravi\\\\ravi-tests\\\\simple.lua\"},\"lines\" : [6],\"breakpoints\" : [{\"line\":6}]} }";
  msgtype = vscode_parse_message(testdata2, strlen(testdata2), &msg, stderr);
  if (msgtype != VSCODE_SET_BREAKPOINTS_REQUEST || msg.seq != 2 ||
    msg.type != VSCODE_REQUEST ||
    strcmp(msg.u.Request.command, "setBreakpoints") != 0 ||
    msg.u.Request.request_type != VSCODE_SET_BREAKPOINTS_REQUEST ||
    strcmp(msg.u.Request.u.SetBreakpointsRequest.source.path, "c:/github/ravi/ravi-tests/simple.lua") != 0 ||
    msg.u.Request.u.SetBreakpointsRequest.breakpoints[0].line != 6) {
	  membuff_free(&mb);  
	  return 1;
  }
  membuff_free(&mb);
  return 0;
}